

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O3

void __thiscall NameServer::generateSplitInfo(NameServer *this)

{
  size_type *psVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  NameServer *this_00;
  uint uVar5;
  uint uVar6;
  pointer piVar7;
  undefined8 *puVar8;
  ulong uVar9;
  double dVar10;
  uint uVar11;
  double dVar12;
  int iVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  vector<int,_std::allocator<int>_> _serverids;
  string __str_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockPathList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  pointer local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_e0;
  double local_a8;
  pointer local_a0;
  vector<int,_std::allocator<int>_> local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  NameServer *local_40;
  double local_38;
  
  std::istream::seekg(0x14f768,_S_beg);
  piVar7 = (pointer)std::istream::tellg();
  std::istream::seekg(0x14f768,_S_beg);
  local_a8 = ceil((double)(long)piVar7 * 4.76837158203125e-07);
  paVar17 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,desFileName_abi_cxx11_._M_dataplus._M_p,
             desFileName_abi_cxx11_._M_dataplus._M_p + desFileName_abi_cxx11_._M_string_length);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_e0.first.field_2 + 8);
  local_e0.first._M_dataplus._M_p._0_4_ = fileID;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p == paVar17) {
    local_e0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_128.field_2._8_8_;
    local_e0.first._M_string_length = (size_type)paVar3;
  }
  else {
    local_e0.first._M_string_length = (size_type)local_128._M_dataplus._M_p;
  }
  local_e0.first.field_2._8_8_ = local_128.field_2._M_allocated_capacity;
  local_e0.first.field_2._M_allocated_capacity = local_128._M_string_length;
  local_128._M_string_length = 0;
  local_128.field_2._M_allocated_capacity =
       local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_128._M_dataplus._M_p = (pointer)paVar17;
  local_108 = piVar7;
  local_e0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar7;
  local_a0 = piVar7;
  std::
  _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,long_long>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
  ::_M_emplace_unique<std::pair<int,std::pair<std::__cxx11::string,long_long>>>
            ((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,long_long>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
              *)&fileid_path_lenMap_abi_cxx11_,
             (pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
              *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_string_length != paVar3) {
    operator_delete((void *)local_e0.first._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar17) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  paVar17 = &local_e0.first.field_2;
  local_e0.first._M_dataplus._M_p = (pointer)paVar17;
  local_40 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,desFileName_abi_cxx11_._M_dataplus._M_p,
             desFileName_abi_cxx11_._M_dataplus._M_p + desFileName_abi_cxx11_._M_string_length);
  local_e0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long_long>,std::_Select1st<std::pair<std::__cxx11::string_const,long_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,long_long>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long_long>,std::_Select1st<std::pair<std::__cxx11::string_const,long_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
              *)&path_lenMap_abi_cxx11_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>
              *)&local_e0);
  uVar15 = (uint)local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar17) {
    operator_delete(local_e0.first._M_dataplus._M_p);
  }
  fileID = fileID + 1;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)uVar15) {
    uVar11 = 0;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,desFileName_abi_cxx11_._M_dataplus._M_p,
                 desFileName_abi_cxx11_._M_dataplus._M_p + desFileName_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)&local_128);
      uVar16 = 1;
      if (9 < uVar11) {
        uVar9 = (ulong)uVar11;
        uVar6 = 4;
        do {
          uVar16 = uVar6;
          uVar5 = (uint)uVar9;
          if (uVar5 < 100) {
            uVar16 = uVar16 - 2;
            goto LAB_001171b0;
          }
          if (uVar5 < 1000) {
            uVar16 = uVar16 - 1;
            goto LAB_001171b0;
          }
          if (uVar5 < 10000) goto LAB_001171b0;
          uVar9 = uVar9 / 10000;
          uVar6 = uVar16 + 4;
        } while (99999 < uVar5);
        uVar16 = uVar16 + 1;
      }
LAB_001171b0:
      local_100 = local_f0;
      std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar16);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100,uVar16,uVar11);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar14 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_f8 + local_128._M_string_length) {
        uVar9 = 0xf;
        if (local_100 != local_f0) {
          uVar9 = local_f0[0];
        }
        if (uVar9 < local_f8 + local_128._M_string_length) goto LAB_00117222;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_100,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_00117222:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_100);
      }
      local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
      psVar1 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_e0.first.field_2._M_allocated_capacity = *psVar1;
        local_e0.first.field_2._8_8_ = puVar8[3];
      }
      else {
        local_e0.first.field_2._M_allocated_capacity = *psVar1;
        local_e0.first._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_e0.first._M_string_length = puVar8[1];
      *puVar8 = psVar1;
      puVar8[1] = 0;
      *(undefined1 *)psVar1 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 &local_e0.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
        operator_delete(local_e0.first._M_dataplus._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar15);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_e0,&desFileName_abi_cxx11_,&local_58);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)&logicFile_BlockFileMap_abi_cxx11_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e0.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
    operator_delete(local_e0.first._M_dataplus._M_p);
  }
  if (0 < (int)uVar15) {
    local_a8 = (double)(ulong)(uVar15 - 1);
    local_38 = (double)(ulong)uVar15;
    dVar12 = 0.0;
    do {
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      uVar15 = SUB84(dVar12,0);
      local_e0.first._M_dataplus._M_p._0_4_ =
           (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | (ulong)dVar12 & 0xffffffff) %
                (long)dataserver_num);
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_98,(iterator)0x0,(int *)&local_e0);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)dVar12 << 0x15);
      iVar4 = (int)local_a0 - (int)paVar17;
      if (dVar12 != local_a8) {
        iVar4 = 0x200000;
      }
      local_e0.first._M_dataplus._M_p._0_4_ =
           (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | (ulong)dVar12 & 0xffffffff) %
                (long)dataserver_num);
      local_e0.first.field_2._M_allocated_capacity._4_4_ = uVar15;
      local_e0.first.field_2._M_allocated_capacity._0_4_ = iVar4;
      local_e0.first._M_string_length = (size_type)paVar17;
      std::
      _Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
      ::_M_emplace_equal<std::pair<int,fileRange>>
                ((_Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                  *)&server_fileRangesMap,(pair<int,_fileRange> *)&local_e0);
      if (1 < replicate_num) {
        iVar13 = 1;
        do {
          local_e0.first._M_string_length = (size_type)paVar17;
          local_e0.first._M_dataplus._M_p._0_4_ = (int)(uVar15 + iVar13) % dataserver_num;
          std::
          _Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
          ::_M_emplace_equal<std::pair<int,fileRange>>
                    ((_Rb_tree<int,std::pair<int_const,fileRange>,std::_Select1st<std::pair<int_const,fileRange>>,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                      *)&server_fileRangesMap,(pair<int,_fileRange> *)&local_e0);
          local_e0.first._M_dataplus._M_p._0_4_ = (int)(uVar15 + iVar13) % dataserver_num;
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_e0);
          }
          else {
            *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = (int)local_e0.first._M_dataplus._M_p;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < replicate_num);
      }
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,desFileName_abi_cxx11_._M_dataplus._M_p,
                 desFileName_abi_cxx11_._M_dataplus._M_p + desFileName_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)&local_100);
      uVar11 = 1;
      if (9 < (ulong)dVar12) {
        uVar16 = 4;
        dVar10 = dVar12;
        do {
          uVar11 = uVar16;
          uVar6 = SUB84(dVar10,0);
          if (uVar6 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_001174f0;
          }
          if (uVar6 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_001174f0;
          }
          if (uVar6 < 10000) goto LAB_001174f0;
          dVar10 = (double)(((ulong)dVar10 & 0xffffffff) / 10000);
          uVar16 = uVar11 + 4;
        } while (99999 < uVar6);
        uVar11 = uVar11 + 1;
      }
LAB_001174f0:
      local_78 = local_68;
      std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar11,uVar15);
      uVar9 = 0xf;
      if (local_100 != local_f0) {
        uVar9 = local_f0[0];
      }
      if (uVar9 < (ulong)(local_70 + local_f8)) {
        uVar9 = 0xf;
        if (local_78 != local_68) {
          uVar9 = local_68[0];
        }
        if (uVar9 < (ulong)(local_70 + local_f8)) goto LAB_0011756d;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_0011756d:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_78);
      }
      puVar2 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2) {
        local_128.field_2._M_allocated_capacity = *puVar2;
        local_128.field_2._8_8_ = puVar8[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *puVar2;
        local_128._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_128._M_string_length = puVar8[1];
      *puVar8 = puVar2;
      puVar8[1] = 0;
      *(undefined1 *)puVar2 = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_&,_true>
                (&local_e0,&local_128,&local_98);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                  *)&block_serversMap_abi_cxx11_,&local_e0);
      if (local_e0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
        operator_delete(local_e0.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      dVar12 = (double)((long)dVar12 + 1);
    } while (dVar12 != local_38);
  }
  this_00 = local_40;
  writeMeta(local_40,id_file);
  writeMeta(this_00,file_len);
  writeMeta(this_00,file_block);
  writeMeta(this_00,block_server);
  writeMeta(this_00,current_id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void generateSplitInfo() const
    {
        ifs.seekg (0, ifs.end);
        long long length = ifs.tellg();
        ifs.seekg (0, ifs.beg);

        int blockNum = (int)ceil(length / block_size);

        // metadata: key=fileId, value=logicFilePath
        fileid_path_lenMap.emplace(make_pair(fileID, make_pair(desFileName, length)));
        path_lenMap.emplace(make_pair(desFileName, length));

        fileID++;

        vector<string> blockPathList;
        for (int i = 0; i < blockNum; i++)
        {
            blockPathList.push_back(desFileName + "-part" + to_string(i));
        }
        logicFile_BlockFileMap.emplace(make_pair(desFileName, blockPathList));

        for (int i = 0; i < blockNum; i++)
        {

            vector<int> _serverids;
            _serverids.push_back(i % dataserver_num);

            fileRange range(i * block_size_int, 0, i);

            if (i == blockNum - 1)
            {
                range.count = length - i * block_size_int;
            }
            else
            {
                range.count = block_size_int;
            }
            server_fileRangesMap.emplace(make_pair(i % dataserver_num, range));
            // still should crate another two replications
            for (int j = 1; j < replicate_num; j++)
            {
                server_fileRangesMap.emplace(make_pair((i + j) % dataserver_num, range));

                _serverids.push_back((i + j) % dataserver_num);
            }

            block_serversMap.emplace(make_pair(desFileName + "-part" + to_string(i),
               _serverids));
        }

        // write metadata info to file
        writeMeta(MetaType::id_file);
        writeMeta(MetaType::file_len);
        writeMeta(MetaType::file_block);
        writeMeta(MetaType::block_server);
        writeMeta(MetaType::current_id);

    }